

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.cpp
# Opt level: O0

IrrXMLReader * irr::io::createIrrXMLReader(FILE *file)

{
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this;
  CFileReadCallBack *this_00;
  FILE *file_local;
  
  this = (CXMLReaderImpl<char,_irr::io::IXMLBase> *)operator_new(0x88);
  this_00 = (CFileReadCallBack *)operator_new(0x18);
  CFileReadCallBack::CFileReadCallBack(this_00,file);
  CXMLReaderImpl<char,_irr::io::IXMLBase>::CXMLReaderImpl(this,(IFileReadCallBack *)this_00,true);
  return &this->super_IIrrXMLReader<char,_irr::io::IXMLBase>;
}

Assistant:

IrrXMLReader* createIrrXMLReader(FILE* file)
{
	return new CXMLReaderImpl<char, IXMLBase>(new CFileReadCallBack(file)); 
}